

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall
wabt::SharedValidator::OnBrTableTarget(SharedValidator *this,Location *loc,Var *depth)

{
  size_t sVar1;
  char *pcVar2;
  undefined8 uVar3;
  Result RVar4;
  Result RVar5;
  
  sVar1 = (loc->filename)._M_len;
  pcVar2 = (loc->filename)._M_str;
  uVar3 = *(undefined8 *)((long)&loc->field_1 + 8);
  (this->expr_loc_).field_1.field_1.offset = (loc->field_1).field_1.offset;
  *(undefined8 *)((long)&(this->expr_loc_).field_1 + 8) = uVar3;
  (this->expr_loc_).filename._M_len = sVar1;
  (this->expr_loc_).filename._M_str = pcVar2;
  if (depth->type_ == Index) {
    RVar4 = TypeChecker::OnBrTableTarget(&this->typechecker_,(depth->field_2).index_);
    RVar5.enum_._1_3_ = 0;
    RVar5.enum_._0_1_ = RVar4.enum_ == Error;
    return (Result)RVar5.enum_;
  }
  __assert_fail("is_index()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/ir.h"
                ,0x3b,"Index wabt::Var::index() const");
}

Assistant:

Result SharedValidator::OnBrTableTarget(const Location& loc, Var depth) {
  Result result = Result::Ok;
  expr_loc_ = loc;
  result |= typechecker_.OnBrTableTarget(depth.index());
  return result;
}